

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *s)

{
  string local_58;
  string local_38;
  string *local_18;
  string *s_local;
  
  local_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_58,(string *)s);
  rtrim(&local_38,&local_58);
  ltrim(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static inline string trim(string s) {
  return ltrim(rtrim(s));
}